

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QXmlStreamEntityDeclaration>::resize(QList<QXmlStreamEntityDeclaration> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QXmlStreamEntityDeclaration> *in_RSI;
  QArrayDataPointer<QXmlStreamEntityDeclaration> *in_RDI;
  QList<QXmlStreamEntityDeclaration> *unaff_retaddr;
  QArrayDataPointer<QXmlStreamEntityDeclaration> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QXmlStreamEntityDeclaration>::size((QList<QXmlStreamEntityDeclaration> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QXmlStreamEntityDeclaration>::operator->(in_RDI);
    QArrayDataPointer<QXmlStreamEntityDeclaration>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }